

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O0

string * __thiscall llama_vocab::impl::type_name_abi_cxx11_(impl *this)

{
  long in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  allocator<char> *in_stack_ffffffffffffffb0;
  allocator<char> *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  allocator<char> local_2a;
  allocator<char> local_29;
  allocator<char> local_28;
  allocator<char> local_27;
  allocator<char> local_26;
  allocator<char> local_25 [20];
  allocator<char> local_11 [17];
  
  pbVar1 = in_RDI;
  switch(*(undefined4 *)(in_RSI + 4)) {
  case 0:
    __a = local_11;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>(pbVar1,(char *)in_RDI,__a);
    ::std::allocator<char>::~allocator(local_11);
    break;
  case 1:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              (pbVar1,(char *)in_RDI,in_stack_ffffffffffffffb0);
    ::std::allocator<char>::~allocator(local_25);
    break;
  case 2:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              (pbVar1,(char *)in_RDI,in_stack_ffffffffffffffb0);
    ::std::allocator<char>::~allocator(&local_26);
    break;
  case 3:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              (pbVar1,(char *)in_RDI,in_stack_ffffffffffffffb0);
    ::std::allocator<char>::~allocator(&local_27);
    break;
  case 4:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              (pbVar1,(char *)in_RDI,in_stack_ffffffffffffffb0);
    ::std::allocator<char>::~allocator(&local_28);
    break;
  case 5:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              (pbVar1,(char *)in_RDI,in_stack_ffffffffffffffb0);
    ::std::allocator<char>::~allocator(&local_29);
    break;
  default:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              (pbVar1,(char *)in_RDI,in_stack_ffffffffffffffb0);
    ::std::allocator<char>::~allocator(&local_2a);
  }
  return (string *)pbVar1;
}

Assistant:

std::string llama_vocab::impl::type_name() const{
    switch (type) {
        case LLAMA_VOCAB_TYPE_NONE: return "no vocab";
        case LLAMA_VOCAB_TYPE_SPM:  return "SPM";
        case LLAMA_VOCAB_TYPE_BPE:  return "BPE";
        case LLAMA_VOCAB_TYPE_WPM:  return "WPM";
        case LLAMA_VOCAB_TYPE_UGM:  return "UGM";
        case LLAMA_VOCAB_TYPE_RWKV: return "RWKV";
        default:                    return "unknown";
    }
}